

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

void __thiscall OpenMD::ZeroConstraint::ZeroConstraint(ZeroConstraint *this)

{
  (this->super_ParamConstraintFacade<OpenMD::ZeroConstraint>).description_._M_dataplus._M_p =
       (pointer)&(this->super_ParamConstraintFacade<OpenMD::ZeroConstraint>).description_.field_2;
  (this->super_ParamConstraintFacade<OpenMD::ZeroConstraint>).description_._M_string_length = 0;
  (this->super_ParamConstraintFacade<OpenMD::ZeroConstraint>).description_.field_2._M_local_buf[0] =
       '\0';
  std::__cxx11::string::assign((char *)this);
  return;
}

Assistant:

ZeroConstraint() { this->description_ = "zero"; }